

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O0

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_58 [4];
  uint i;
  uv_barrier_t barrier;
  uv_thread_t threads [4];
  
  iVar1 = uv_barrier_init((uv_barrier_t *)local_58,5);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-barrier.c"
            ,0x88,"uv_barrier_init(&barrier, (sizeof(threads) / sizeof((threads)[0])) + 1)","==","0"
            ,(long)iVar1,"==",0);
    abort();
  }
  eval_a._4_4_ = 0;
  while( true ) {
    if (3 < eval_a._4_4_) {
      for (eval_a._4_4_ = 0; eval_a._4_4_ < 5; eval_a._4_4_ = eval_a._4_4_ + 1) {
        uv_barrier_wait((uv_barrier_t *)local_58);
      }
      iVar1 = uv_barrier_wait((uv_barrier_t *)local_58);
      if (0 < iVar1) {
        uv_barrier_destroy((uv_barrier_t *)local_58);
      }
      eval_a._4_4_ = 0;
      while( true ) {
        if (3 < eval_a._4_4_) {
          return 0;
        }
        iVar1 = uv_thread_join(threads + ((ulong)eval_a._4_4_ - 1));
        if ((long)iVar1 != 0) break;
        eval_a._4_4_ = eval_a._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-barrier.c"
              ,0x93,"uv_thread_join(&threads[i])","==","0",(long)iVar1,"==",0);
      abort();
    }
    iVar1 = uv_thread_create(threads + ((ulong)eval_a._4_4_ - 1),serial_worker,local_58);
    if ((long)iVar1 != 0) break;
    eval_a._4_4_ = eval_a._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-barrier.c"
          ,0x8b,"uv_thread_create(&threads[i], serial_worker, &barrier)","==","0",(long)iVar1,"==",0
         );
  abort();
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT_OK(uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_create(&threads[i], serial_worker, &barrier));

  for (i = 0; i < 5; i++)
    uv_barrier_wait(&barrier);
  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_join(&threads[i]));

  return 0;
}